

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<const_char_*> __thiscall asl::Array<asl::String>::with<char_const*>(Array<asl::String> *this)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  Array<asl::String> *in_RSI;
  int local_20;
  int i;
  Array<asl::String> *this_local;
  Array<const_char_*> *b;
  
  iVar1 = length(in_RSI);
  Array<const_char_*>::Array((Array<const_char_*> *)this,iVar1);
  for (local_20 = 0; iVar1 = length(in_RSI), local_20 < iVar1; local_20 = local_20 + 1) {
    pcVar2 = asl::String::operator_cast_to_char_(in_RSI->_a + local_20);
    ppcVar3 = Array<const_char_*>::operator[]((Array<const_char_*> *)this,local_20);
    *ppcVar3 = pcVar2;
  }
  return (Array<const_char_*>)(char **)this;
}

Assistant:

Array<K> with() const
	{
		Array<K> b(length());
		for (int i = 0; i < length(); i++)
			b[i] = (K)_a[i];
		return b;
	}